

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::bindBuffer(ReferenceContext *this,deUint32 target,deUint32 buffer)

{
  bool bVar1;
  DataBuffer *object;
  
  bVar1 = isValidBufferTarget(target);
  if (bVar1) {
    if (buffer == 0) {
      object = (DataBuffer *)0x0;
    }
    else {
      object = rc::ObjectManager<sglr::rc::DataBuffer>::find(&this->m_buffers,buffer);
      if (object == (DataBuffer *)0x0) {
        object = (DataBuffer *)operator_new(0x28);
        (object->super_NamedObject).m_name = buffer;
        (object->super_NamedObject).m_refCount = 1;
        (object->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__DataBuffer_01e70ee8;
        (object->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (object->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (object->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        rc::ObjectManager<sglr::rc::DataBuffer>::insert(&this->m_buffers,object);
      }
    }
    setBufferBinding(this,target,object);
    return;
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::bindBuffer (deUint32 target, deUint32 buffer)
{
	RC_IF_ERROR(!isValidBufferTarget(target), GL_INVALID_ENUM, RC_RET_VOID);

	rc::DataBuffer*	bufObj	= DE_NULL;

	if (buffer != 0)
	{
		bufObj = m_buffers.find(buffer);
		if (!bufObj)
		{
			bufObj = new DataBuffer(buffer);
			m_buffers.insert(bufObj);
		}
	}

	setBufferBinding(target, bufObj);
}